

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_decoder__on_seek_memory(ma_decoder *pDecoder,ma_int64 byteOffset,ma_seek_origin origin)

{
  ulong uVar1;
  ma_vfs_file pvVar2;
  ma_vfs_file pvVar3;
  long lVar4;
  
  if (origin == ma_seek_origin_end) {
    lVar4 = -byteOffset;
    if (0 < byteOffset) {
      lVar4 = byteOffset;
    }
    pvVar2 = (pDecoder->data).vfs.file;
    pvVar3 = (ma_vfs_file)((long)pvVar2 - lVar4);
    if ((long)pvVar2 < lVar4) {
      (pDecoder->data).memory.currentReadPos = 0;
      return MA_SUCCESS;
    }
  }
  else {
    if (origin == ma_seek_origin_current) {
      uVar1 = (pDecoder->data).memory.currentReadPos;
      if (0 < byteOffset) {
        pvVar2 = (pDecoder->data).vfs.file;
        lVar4 = (long)pvVar2 - uVar1;
        if ((ma_vfs_file)(uVar1 + byteOffset) <= pvVar2) {
          lVar4 = byteOffset;
        }
        (pDecoder->data).memory.currentReadPos = lVar4 + uVar1;
        return MA_SUCCESS;
      }
      lVar4 = -uVar1;
      if ((ulong)-byteOffset <= uVar1) {
        lVar4 = byteOffset;
      }
      (pDecoder->data).memory.currentReadPos = lVar4 + uVar1;
      return MA_SUCCESS;
    }
    pvVar3 = (pDecoder->data).vfs.file;
    if ((ulong)byteOffset <= pvVar3) {
      (pDecoder->data).memory.currentReadPos = byteOffset;
      return MA_SUCCESS;
    }
  }
  (pDecoder->data).memory.currentReadPos = (size_t)pvVar3;
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_decoder__on_seek_memory(ma_decoder* pDecoder, ma_int64 byteOffset, ma_seek_origin origin)
{
    if (byteOffset > 0 && (ma_uint64)byteOffset > MA_SIZE_MAX) {
        return MA_BAD_SEEK;
    }

    if (origin == ma_seek_origin_current) {
        if (byteOffset > 0) {
            if (pDecoder->data.memory.currentReadPos + byteOffset > pDecoder->data.memory.dataSize) {
                byteOffset = (ma_int64)(pDecoder->data.memory.dataSize - pDecoder->data.memory.currentReadPos);  /* Trying to seek too far forward. */
            }

            pDecoder->data.memory.currentReadPos += (size_t)byteOffset;
        } else {
            if (pDecoder->data.memory.currentReadPos < (size_t)-byteOffset) {
                byteOffset = -(ma_int64)pDecoder->data.memory.currentReadPos;  /* Trying to seek too far backwards. */
            }

            pDecoder->data.memory.currentReadPos -= (size_t)-byteOffset;
        }
    } else {
        if (origin == ma_seek_origin_end) {
            if (byteOffset < 0) {
                byteOffset = -byteOffset;
            }

            if (byteOffset > (ma_int64)pDecoder->data.memory.dataSize) {
                pDecoder->data.memory.currentReadPos = 0;   /* Trying to seek too far back. */
            } else {
                pDecoder->data.memory.currentReadPos = pDecoder->data.memory.dataSize - (size_t)byteOffset;
            }
        } else {
            if ((size_t)byteOffset <= pDecoder->data.memory.dataSize) {
                pDecoder->data.memory.currentReadPos = (size_t)byteOffset;
            } else {
                pDecoder->data.memory.currentReadPos = pDecoder->data.memory.dataSize;  /* Trying to seek too far forward. */
            }
        }
    }

    return MA_SUCCESS;
}